

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_for_each.cpp
# Opt level: O0

void stateful_for_each<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  code *pcVar1;
  double dVar2;
  GuidedPartitioner<tf::DefaultClosureWrapper> part;
  reference_wrapper<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  beg_00;
  byte extraout_AL;
  byte extraout_AL_00;
  byte extraout_AL_01;
  reference pvVar3;
  undefined1 *__stat_loc;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  Expression_lhs<const_std::atomic<int>_&> EVar4;
  Expression_lhs<const_int_&> EVar5;
  ResultBuilder DOCTEST_RB_2;
  size_t i_1;
  ResultBuilder DOCTEST_RB_1;
  size_t i;
  ResultBuilder DOCTEST_RB;
  Task pf2;
  Task pf1;
  Task init;
  size_t half;
  size_t iend;
  size_t ibeg;
  iterator end;
  iterator beg;
  size_t c;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<int> *__range2;
  size_t n;
  atomic<int> counter;
  vector<int,_std::allocator<int>_> vec;
  Taskflow taskflow;
  Executor executor;
  Result *in_stack_fffffffffffff998;
  Taskflow *in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a8;
  Enum in_stack_fffffffffffff9ac;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff9b0;
  Enum in_stack_fffffffffffff9bc;
  Taskflow *in_stack_fffffffffffff9c0;
  Executor *in_stack_fffffffffffff9d0;
  anon_class_64_8_523e6f90 *c_00;
  FlowBuilder *this;
  undefined4 in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa04;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffa08;
  Enum in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa14;
  anon_class_8_1_bc7188dc in_stack_fffffffffffffa18;
  reference_wrapper<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  in_stack_fffffffffffffa20;
  Enum in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa2c;
  PartitionerBase<tf::DefaultClosureWrapper> in_stack_fffffffffffffa30;
  reference_wrapper<unsigned_long> in_stack_fffffffffffffa40;
  reference_wrapper<unsigned_long> in_stack_fffffffffffffa48;
  anon_class_16_2_8c4dd181 in_stack_fffffffffffffa60;
  undefined8 in_stack_fffffffffffffa88;
  undefined8 in_stack_fffffffffffffa90;
  undefined8 in_stack_fffffffffffffa98;
  size_type local_538;
  ExpressionDecomposer local_514;
  Taskflow *local_510;
  Enum local_508;
  ResultBuilder local_4e0;
  ulong local_468;
  Executor *local_460;
  Enum local_458;
  ExpressionDecomposer local_44c;
  Executor *local_448;
  Enum local_440;
  ResultBuilder local_418;
  __basic_future<void> local_3a0 [3];
  undefined1 *local_370;
  Taskflow *pTStack_368;
  unsigned_long *local_360;
  unsigned_long *local_358;
  Task local_350 [3];
  undefined1 *local_338;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *local_330;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *local_328;
  Task local_320;
  Task local_318;
  Task local_310;
  undefined1 *local_308;
  ulong *local_300;
  size_t **local_2f8;
  anon_class_64_8_523e6f90 *local_2f0;
  ulong *local_2e8;
  ulong *local_2e0;
  ulong *local_2d8;
  undefined1 *local_2d0;
  ulong local_2c0 [3];
  anon_class_64_8_523e6f90 local_2a8;
  initializer_list<int> local_268;
  initializer_list<int> *local_258;
  ulong local_250;
  undefined1 local_244 [4];
  undefined1 local_240 [256];
  undefined1 local_140 [320];
  
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998)
  ;
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffa88);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x17b556);
  tf::Taskflow::Taskflow(in_stack_fffffffffffff9c0);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x17b572);
  memset(local_244,0,4);
  local_250 = 0;
  do {
    if (0x96 < local_250) {
      std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffff9b0);
      tf::Taskflow::~Taskflow(in_stack_fffffffffffff9a0);
      tf::Executor::~Executor(in_stack_fffffffffffff9d0);
      return;
    }
    local_2a8._44_8_ = 0x100000000;
    local_2a8._52_8_ = 0x700000003;
    local_2a8.counter._4_4_ = 99;
    local_268._M_array = (iterator)((long)&local_2a8.ibeg + 4);
    local_268._M_len = 5;
    local_258 = &local_268;
    local_2a8.half = (size_t *)std::initializer_list<int>::begin(local_258);
    local_2a8.end =
         (iterator *)
         std::initializer_list<int>::end((initializer_list<int> *)in_stack_fffffffffffff9a0);
    for (; (iterator *)local_2a8.half != local_2a8.end;
        local_2a8.half = (size_t *)((long)(int **)local_2a8.half + 4)) {
      local_2a8.beg = (iterator *)(long)*(int *)(int **)local_2a8.half;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
      __normal_iterator((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &local_2a8.n);
      c_00 = &local_2a8;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
      __normal_iterator((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)c_00);
      local_2c0[2] = 0;
      local_2c0[1] = 0;
      local_2c0[0] = local_250 >> 1;
      this = (FlowBuilder *)(local_240 + 0x18);
      tf::Taskflow::clear((Taskflow *)0x17b6af);
      local_308 = local_240;
      local_300 = &local_250;
      local_2e8 = local_2c0;
      local_2e0 = local_2c0 + 2;
      local_2d8 = local_2c0 + 1;
      local_2d0 = local_244;
      local_2f8 = &local_2a8.n;
      local_2f0 = c_00;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_for_each_cpp:295:36),_nullptr>
                (this,c_00);
      tf::Task::Task(&local_310);
      tf::Task::Task(&local_318);
      local_328 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                  std::ref<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             in_stack_fffffffffffff998);
      local_330 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                  std::ref<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             in_stack_fffffffffffff998);
      local_338 = local_244;
      tf::GuidedPartitioner<tf::DefaultClosureWrapper>::GuidedPartitioner
                ((GuidedPartitioner<tf::DefaultClosureWrapper> *)in_stack_fffffffffffff9a0,
                 (size_t)in_stack_fffffffffffff998);
      beg_00._M_data._4_4_ = in_stack_fffffffffffffa2c;
      beg_00._M_data._0_4_ = in_stack_fffffffffffffa28;
      part.super_PartitionerBase<tf::DefaultClosureWrapper>._8_4_ = in_stack_fffffffffffffa10;
      part.super_PartitionerBase<tf::DefaultClosureWrapper>._chunk_size =
           (size_t)in_stack_fffffffffffffa08;
      part.super_PartitionerBase<tf::DefaultClosureWrapper>._12_4_ = in_stack_fffffffffffffa14;
      tf::FlowBuilder::
      for_each<std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,stateful_for_each<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(int&)_1_,tf::GuidedPartitioner<tf::DefaultClosureWrapper>>
                ((FlowBuilder *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),beg_00
                 ,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,part);
      tf::Task::operator=(&local_310,&local_320);
      local_358 = (unsigned_long *)
                  std::ref<unsigned_long>((unsigned_long *)in_stack_fffffffffffff998);
      local_360 = (unsigned_long *)
                  std::ref<unsigned_long>((unsigned_long *)in_stack_fffffffffffff998);
      local_370 = local_244;
      pTStack_368 = (Taskflow *)local_240;
      tf::GuidedPartitioner<tf::DefaultClosureWrapper>::GuidedPartitioner
                ((GuidedPartitioner<tf::DefaultClosureWrapper> *)in_stack_fffffffffffff9a0,
                 (size_t)in_stack_fffffffffffff998);
      in_stack_fffffffffffff9a0 = pTStack_368;
      tf::FlowBuilder::
      for_each_index<std::reference_wrapper<unsigned_long>,std::reference_wrapper<unsigned_long>,unsigned_long,stateful_for_each<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(unsigned_long)_1_,tf::GuidedPartitioner<tf::DefaultClosureWrapper>>
                ((FlowBuilder *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                 (unsigned_long)in_stack_fffffffffffffa20._M_data,in_stack_fffffffffffffa60,
                 (GuidedPartitioner<tf::DefaultClosureWrapper>)in_stack_fffffffffffffa30);
      tf::Task::operator=(&local_318,local_350);
      tf::Task::precede<tf::Task&,tf::Task&>
                ((Task *)in_stack_fffffffffffff9b0,
                 (Task *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                 (Task *)in_stack_fffffffffffff9a0);
      __stat_loc = local_140;
      tf::Executor::run((Executor *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                        in_stack_fffffffffffff9a0);
      std::__basic_future<void>::wait(local_3a0,__stat_loc);
      tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffff9a0);
      in_stack_fffffffffffff998 = (Result *)0x1ec1b1;
      doctest::detail::ResultBuilder::ResultBuilder
                ((ResultBuilder *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc,
                 (char *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac,
                 (char *)in_stack_fffffffffffff9a0,"",(char *)in_stack_fffffffffffff9d0);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_44c,DT_REQUIRE);
      EVar4 = doctest::detail::ExpressionDecomposer::operator<<<std::atomic<int>,_nullptr>
                        ((ExpressionDecomposer *)in_stack_fffffffffffff9a0,
                         (atomic<int> *)in_stack_fffffffffffff998);
      in_stack_fffffffffffff9d0 = (Executor *)EVar4.lhs;
      local_458 = EVar4.m_at;
      local_460 = in_stack_fffffffffffff9d0;
      local_448 = in_stack_fffffffffffff9d0;
      local_440 = local_458;
      doctest::detail::Expression_lhs<const_std::atomic<int>_&>::operator==<unsigned_long,_nullptr>
                ((Expression_lhs<const_std::atomic<int>_&> *)
                 CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                 (unsigned_long *)in_stack_fffffffffffffa20._M_data);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      doctest::detail::Result::~Result((Result *)0x17b9f4);
      dVar2 = doctest::detail::ResultBuilder::log
                        (&local_418,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      if ((extraout_AL & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffff9a0);
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x17bb48);
      for (local_468 = 0; local_468 < local_2c0[0]; local_468 = local_468 + 1) {
        in_stack_fffffffffffff998 = (Result *)0x1ec1b1;
        doctest::detail::ResultBuilder::ResultBuilder
                  ((ResultBuilder *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc,
                   (char *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac,
                   (char *)in_stack_fffffffffffff9a0,"",(char *)in_stack_fffffffffffff9d0);
        doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_514,DT_REQUIRE);
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)local_240,local_468);
        EVar5 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                          ((ExpressionDecomposer *)in_stack_fffffffffffff9a0,
                           (int *)in_stack_fffffffffffff998);
        in_stack_fffffffffffff9c0 = (Taskflow *)EVar5.lhs;
        in_stack_fffffffffffff9bc = EVar5.m_at;
        local_510 = in_stack_fffffffffffff9c0;
        local_508 = in_stack_fffffffffffff9bc;
        doctest::detail::Expression_lhs<int_const&>::operator==
                  ((Expression_lhs<const_int_&> *)
                   CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                   (int *)in_stack_fffffffffffffa20._M_data);
        doctest::detail::ResultBuilder::setResult
                  ((ResultBuilder *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
        doctest::detail::Result::~Result((Result *)0x17bc6a);
        dVar2 = doctest::detail::ResultBuilder::log
                          (&local_4e0,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        if ((extraout_AL_00 & 1) != 0) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffff9a0);
        doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x17bd49);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_240,local_468);
        *pvVar3 = 0;
      }
      for (local_538 = local_2c0[0]; local_538 < local_250; local_538 = local_538 + 1) {
        in_stack_fffffffffffff998 = (Result *)0x1ec1b1;
        doctest::detail::ResultBuilder::ResultBuilder
                  ((ResultBuilder *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc,
                   (char *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac,
                   (char *)in_stack_fffffffffffff9a0,"",(char *)in_stack_fffffffffffff9d0);
        doctest::detail::ExpressionDecomposer::ExpressionDecomposer
                  ((ExpressionDecomposer *)&stack0xfffffffffffffa1c,DT_REQUIRE);
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)local_240,local_538);
        EVar5 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                          ((ExpressionDecomposer *)in_stack_fffffffffffff9a0,
                           (int *)in_stack_fffffffffffff998);
        in_stack_fffffffffffff9b0 = (vector<int,_std::allocator<int>_> *)EVar5.lhs;
        in_stack_fffffffffffff9ac = EVar5.m_at;
        in_stack_fffffffffffffa04 = 0xfffffff8;
        in_stack_fffffffffffffa08 = in_stack_fffffffffffff9b0;
        in_stack_fffffffffffffa10 = in_stack_fffffffffffff9ac;
        in_stack_fffffffffffffa20._M_data =
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffff9b0;
        in_stack_fffffffffffffa28 = in_stack_fffffffffffff9ac;
        doctest::detail::Expression_lhs<int_const&>::operator==
                  ((Expression_lhs<const_int_&> *)
                   CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffff9ac),
                   (int *)in_stack_fffffffffffff9b0);
        doctest::detail::ResultBuilder::setResult
                  ((ResultBuilder *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
        doctest::detail::Result::~Result((Result *)0x17bea3);
        dVar2 = doctest::detail::ResultBuilder::log
                          ((ResultBuilder *)&stack0xfffffffffffffa50,
                           (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
        in_stack_fffffffffffff9a8 = CONCAT13(extraout_AL_01,(int3)in_stack_fffffffffffff9a8);
        if ((extraout_AL_01 & 1) != 0) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffff9a0);
        doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x17bf70);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_240,local_538);
        *pvVar3 = 0;
      }
    }
    local_250 = local_250 + 1;
  } while( true );
}

Assistant:

void stateful_for_each(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;
  std::vector<int> vec;
  std::atomic<int> counter {0};

  for(size_t n = 0; n <= 150; n++) {
    for(size_t c : {0, 1, 3, 7, 99}) {

      std::vector<int>::iterator beg, end;
      size_t ibeg = 0, iend = 0;
      size_t half = n/2;

      taskflow.clear();

      auto init = taskflow.emplace([&](){
        vec.resize(n);
        std::fill_n(vec.begin(), vec.size(), -1);

        beg = vec.begin();
        end = beg + half;

        ibeg = half;
        iend = n;

        counter = 0;
      });

      tf::Task pf1, pf2;

      pf1 = taskflow.for_each(
        std::ref(beg), std::ref(end), [&](int& i){
        counter++;
        i = 8;
      }, P(c));

      pf2 = taskflow.for_each_index(
        std::ref(ibeg), std::ref(iend), size_t{1}, [&] (size_t i) {
          counter++;
          vec[i] = -8;
      }, P(c));

      init.precede(pf1, pf2);

      executor.run(taskflow).wait();
      REQUIRE(counter == n);

      for(size_t i=0; i<half; ++i) {
        REQUIRE(vec[i] == 8);
        vec[i] = 0;
      }

      for(size_t i=half; i<n; ++i) {
        REQUIRE(vec[i] == -8);
        vec[i] = 0;
      }
    }
  }
}